

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall btMultiBody::finalizeMultiDof(btMultiBody *this)

{
  btVector3 local_28;
  
  local_28.m_floats[0] = 0.0;
  btAlignedObjectArray<float>::resize(&this->m_deltaV,0,local_28.m_floats);
  local_28.m_floats[0] = 0.0;
  btAlignedObjectArray<float>::resize(&this->m_deltaV,this->m_dofCount + 6,local_28.m_floats);
  local_28.m_floats[0] = 0.0;
  btAlignedObjectArray<float>::resize
            (&this->m_realBuf,(this->m_dofCount + 2) * this->m_dofCount + 0xc,local_28.m_floats);
  btAlignedObjectArray<btVector3>::resize(&this->m_vectorBuf,this->m_dofCount * 2,&local_28);
  updateLinksDofOffsets(this);
  return;
}

Assistant:

void btMultiBody::finalizeMultiDof()
{
	m_deltaV.resize(0);
	m_deltaV.resize(6 + m_dofCount);
	m_realBuf.resize(6 + m_dofCount + m_dofCount*m_dofCount + 6 + m_dofCount);			//m_dofCount for joint-space vels + m_dofCount^2 for "D" matrices + delta-pos vector (6 base "vels" + joint "vels")
	m_vectorBuf.resize(2 * m_dofCount);													//two 3-vectors (i.e. one six-vector) for each system dof	("h" matrices)

	updateLinksDofOffsets();
}